

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLReader::refreshRawBuffer(XMLReader *this)

{
  int iVar1;
  XMLByte *pXVar2;
  undefined4 extraout_var;
  RuntimeException *this_00;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  lVar4 = this->fRawBytesAvail - this->fRawBufIndex;
  if (this->fRawBufIndex <= this->fRawBytesAvail) {
    pXVar2 = this->fRawByteBuf;
    lVar3 = lVar4;
    while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
      *pXVar2 = pXVar2[this->fRawBufIndex];
      pXVar2 = pXVar2 + 1;
    }
    iVar1 = (*this->fStream->_vptr_BinInputStream[3])
                      (this->fStream,this->fRawByteBuf + lVar4,0xc000 - lVar4);
    this->fRawBytesAvail = CONCAT44(extraout_var,iVar1) + lVar4;
    this->fRawBufIndex = 0;
    return;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
             ,0x761,Str_StartIndexPastEnd,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
             this->fMemoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLReader::refreshRawBuffer()
{
    // Make sure we don't underflow on the subtraction.
    if (fRawBufIndex > fRawBytesAvail) {
        ThrowXMLwithMemMgr1
        (
            RuntimeException
            , XMLExcepts::Str_StartIndexPastEnd
            , fSystemId
            , fMemoryManager
        );
    }

    //
    //  If there are any bytes left, move them down to the start. There
    //  should only ever be (max bytes per char - 1) at the most.
    //
    const XMLSize_t bytesLeft = fRawBytesAvail - fRawBufIndex;

    // Move the existing ones down
    for (XMLSize_t index = 0; index < bytesLeft; index++)
        fRawByteBuf[index] = fRawByteBuf[fRawBufIndex + index];

    //
    //  And then read into the buffer past the existing bytes. Add back in
    //  that many to the bytes read, and subtract that many from the bytes
    //  requested.
    //
    fRawBytesAvail = fStream->readBytes
    (
        &fRawByteBuf[bytesLeft], kRawBufSize - bytesLeft
    ) + bytesLeft;

    //
    //  We need to reset the buffer index back to the start in all cases,
    //  since any trailing data was copied down to the start.
    //
    fRawBufIndex = 0;
}